

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O3

void coda_str64(int64_t a,char *s)

{
  undefined1 auVar1 [16];
  
  if (a < 0) {
    *s = '-';
    coda_str64u(-a,s + 1);
    return;
  }
  if ((ulong)a >> 0x20 == 0) {
    sprintf(s,"%ld",a);
    return;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)a / 100000000;
  if ((ulong)a < 10000000000000000) {
    sprintf(s,"%ld%08ld",
            (ulong)a / 100000000 +
            (ulong)(SUB164(auVar1 * ZEXT816(0x55e63b88c3),8) >> 1) * -100000000,(ulong)a % 100000000
           );
    return;
  }
  sprintf(s,"%ld%08ld%08ld",(ulong)a / 10000000000000000);
  return;
}

Assistant:

LIBCODA_API void coda_str64(int64_t a, char *s)
{
    if (a < 0)
    {
        s[0] = '-';
        /* shift by one to account for lowest negative value being one off compared to highest postive value */
        coda_str64u((uint64_t)(-(a + 1)) + 1, &s[1]);
    }
    else
    {
        coda_str64u((uint64_t)a, s);
    }
}